

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int flags,char *pText,int nText,
                      _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  void *local_58;
  PorterContext sCtx;
  PorterTokenizer *p;
  _func_int_void_ptr_int_char_ptr_int_int_int *xToken_local;
  int nText_local;
  char *pText_local;
  int flags_local;
  void *pCtx_local;
  Fts5Tokenizer *pTokenizer_local;
  
  sCtx.xToken = (_func_int_void_ptr_int_char_ptr_int_int_int *)(pTokenizer + 0x20);
  local_58 = pCtx;
  sCtx.pCtx = xToken;
  sCtx.aBuf = (char *)pTokenizer;
  iVar1 = (**(code **)(pTokenizer + 0x10))
                    (*(undefined8 *)(pTokenizer + 0x18),&local_58,flags,pText,nText,fts5PorterCb);
  return iVar1;
}

Assistant:

static int fts5PorterTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int flags,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  PorterTokenizer *p = (PorterTokenizer*)pTokenizer;
  PorterContext sCtx;
  sCtx.xToken = xToken;
  sCtx.pCtx = pCtx;
  sCtx.aBuf = p->aBuf;
  return p->tokenizer.xTokenize(
      p->pTokenizer, (void*)&sCtx, flags, pText, nText, fts5PorterCb
  );
}